

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O0

void Min_EsopMinimize(Min_Man_t *p)

{
  int iVar1;
  int nIter;
  int nCubesOld;
  int nCubesInit;
  Min_Man_t *p_local;
  
  if (2 < p->nCubes) {
    do {
      iVar1 = p->nCubes;
      Min_EsopRewrite(p);
    } while (3.0 < ((double)(iVar1 - p->nCubes) * 100.0) / (double)iVar1);
  }
  return;
}

Assistant:

void Min_EsopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_EsopRewrite( p );
        nIter++;
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );

//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
}